

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_cstr.c
# Opt level: O0

size_t zt_cstr_rspn(char *s,char *accept)

{
  size_t sVar1;
  size_t sVar2;
  char *in_RSI;
  char *in_RDI;
  ssize_t i;
  size_t len;
  size_t local_28;
  
  sVar1 = strlen(in_RDI);
  local_28 = sVar1;
  do {
    local_28 = local_28 - 1;
    if ((long)local_28 < 1) {
      return sVar1;
    }
    sVar2 = strspn(in_RDI + local_28,in_RSI);
  } while (sVar2 != 0);
  return (sVar1 - local_28) - 1;
}

Assistant:

size_t
zt_cstr_rspn(const char *s, const char *accept) {
    size_t    len = strlen(s);
    ssize_t   i   = 0;

    zt_assert(s);
    zt_assert(accept);

    for (i = len - 1; i > 0; i--) { /* -1 to skip \0 */
        if (strspn(&s[i], accept) == 0) {
            return (len - i) - 1;                          /* -1 for the first non matching char */
        }
    }
    return len;
}